

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void swap_suite::swap_array(void)

{
  bool bVar1;
  type v;
  type_conflict4 tVar2;
  char *pcVar3;
  basic_variable<std::allocator<char>_> *pbVar4;
  type_conflict9 tVar5;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1520;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1500;
  basic_variable<std::allocator<char>_> *local_14e8;
  basic_variable<std::allocator<char>_> *local_14d0;
  basic_variable<std::allocator<char>_> *local_14b0;
  basic_variable<std::allocator<char>_> *local_1498;
  basic_variable<std::allocator<char>_> *local_1470;
  basic_variable<std::allocator<char>_> *local_1448;
  basic_variable<std::allocator<char>_> *local_1420;
  basic_variable<std::allocator<char>_> *local_13f8;
  basic_variable<std::allocator<char>_> *local_13d0;
  basic_variable<std::allocator<char>_> *local_13a8;
  basic_variable<std::allocator<char>_> *local_1380;
  basic_variable<std::allocator<char>_> *local_1360;
  iterator local_1350;
  iterator local_1338;
  iterator local_1320;
  iterator local_1308;
  double local_12f0;
  int local_12e8;
  bool local_12e1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_12e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_12d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1278;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1218;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_11b8;
  undefined1 local_1158 [24];
  variable expect_1;
  double local_1110;
  int local_1108;
  bool local_1101;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1100;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_10f8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1098;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1038;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_fd8;
  undefined1 local_f78 [16];
  undefined1 local_f68 [8];
  variable other_9;
  basic_variable<std::allocator<char>_> local_f28;
  basic_variable<std::allocator<char>_> local_ef8;
  basic_variable<std::allocator<char>_> local_ec8;
  basic_variable<std::allocator<char>_> local_e98;
  undefined1 local_e68 [16];
  undefined1 local_e58 [8];
  variable data_9;
  iterator local_e20;
  iterator local_e08;
  iterator local_df0;
  iterator local_dd8;
  basic_variable<std::allocator<char>_> *local_dc0;
  basic_variable<std::allocator<char>_> local_db8;
  basic_variable<std::allocator<char>_> local_d88;
  basic_variable<std::allocator<char>_> local_d58;
  basic_variable<std::allocator<char>_> local_d28;
  undefined1 local_cf8 [24];
  variable expect;
  basic_variable<std::allocator<char>_> local_ca8;
  basic_variable<std::allocator<char>_> local_c78;
  basic_variable<std::allocator<char>_> local_c48;
  basic_variable<std::allocator<char>_> local_c18;
  undefined1 local_be8 [16];
  undefined1 local_bd8 [8];
  variable other_8;
  basic_variable<std::allocator<char>_> local_b98;
  basic_variable<std::allocator<char>_> local_b68;
  basic_variable<std::allocator<char>_> local_b38;
  basic_variable<std::allocator<char>_> local_b08;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [8];
  variable data_8;
  undefined1 local_a78 [8];
  variable other_7;
  basic_variable<std::allocator<char>_> local_a38;
  basic_variable<std::allocator<char>_> local_a08;
  basic_variable<std::allocator<char>_> local_9d8;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 local_978 [24];
  variable data_7;
  undefined1 local_918 [8];
  variable other_6;
  basic_variable<std::allocator<char>_> local_8d8;
  basic_variable<std::allocator<char>_> local_8a8;
  basic_variable<std::allocator<char>_> local_878;
  basic_variable<std::allocator<char>_> local_848;
  undefined1 local_818 [24];
  variable data_6;
  undefined1 local_7b8 [8];
  variable other_5;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  basic_variable<std::allocator<char>_> local_718;
  basic_variable<std::allocator<char>_> local_6e8;
  undefined1 local_6b8 [24];
  variable data_5;
  undefined1 local_658 [8];
  variable other_4;
  basic_variable<std::allocator<char>_> local_618;
  basic_variable<std::allocator<char>_> local_5e8;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_558 [24];
  variable data_4;
  variable other_3;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  basic_variable<std::allocator<char>_> local_478;
  basic_variable<std::allocator<char>_> local_448;
  undefined1 local_418 [24];
  variable data_3;
  variable other_2;
  basic_variable<std::allocator<char>_> local_398;
  basic_variable<std::allocator<char>_> local_368;
  basic_variable<std::allocator<char>_> local_338;
  basic_variable<std::allocator<char>_> local_308;
  undefined1 local_2d8 [24];
  variable data_2;
  variable other_1;
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  undefined1 local_198 [24];
  variable data_1;
  variable other;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"alpha");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_1360 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_1360 = local_1360 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1360);
  } while (local_1360 != &local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  boost::detail::test_impl
            ("data.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa1a,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)&data_1.storage.field_0x28);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa1b,"void swap_suite::swap_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_258,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_228,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_1f8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8,"alpha");
  local_198._0_8_ = &local_258;
  local_198._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_198);
  local_1380 = (basic_variable<std::allocator<char>_> *)local_198;
  do {
    local_1380 = local_1380 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1380);
  } while (local_1380 != &local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&data_2.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10),
             (basic_variable<std::allocator<char>_> *)&data_2.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa23,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)&data_2.storage.field_0x28);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa24,"void swap_suite::swap_array()",bVar1);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::boolean>
                ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  boost::detail::test_impl
            ("data.value<boolean>() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa25,"void swap_suite::swap_array()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_398,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_368,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_338,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_308,"alpha");
  local_2d8._0_8_ = &local_398;
  local_2d8._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_2d8);
  local_13a8 = (basic_variable<std::allocator<char>_> *)local_2d8;
  do {
    local_13a8 = local_13a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_13a8);
  } while (local_13a8 != &local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&data_3.storage.field_0x28,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10),
             (basic_variable<std::allocator<char>_> *)&data_3.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                    ((basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10));
  boost::detail::test_impl
            ("data.is<integer>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa2d,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)&data_3.storage.field_0x28);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa2e,"void swap_suite::swap_array()",bVar1);
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::integer>
                    ((basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10));
  boost::detail::test_impl
            ("data.value<integer>() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa2f,"void swap_suite::swap_array()",tVar2 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4d8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_4a8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_478,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_448,"alpha");
  local_418._0_8_ = &local_4d8;
  local_418._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_418);
  local_13d0 = (basic_variable<std::allocator<char>_> *)local_418;
  do {
    local_13d0 = local_13d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_13d0);
  } while (local_13d0 != &local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&data_4.storage.field_0x28,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10),
             (basic_variable<std::allocator<char>_> *)&data_4.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                    ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10));
  boost::detail::test_impl
            ("data.is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa37,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)&data_4.storage.field_0x28);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa38,"void swap_suite::swap_array()",bVar1);
  tVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::real>
                    ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10));
  boost::detail::test_impl
            ("data.value<real>() == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa39,"void swap_suite::swap_array()",(bool)(-(tVar5 == 3.0) & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_618,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_5e8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5b8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_588,"alpha");
  local_558._0_8_ = &local_618;
  local_558._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_558 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_558);
  local_13f8 = (basic_variable<std::allocator<char>_> *)local_558;
  do {
    local_13f8 = local_13f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_13f8);
  } while (local_13f8 != &local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_658,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_558 + 0x10),
             (basic_variable<std::allocator<char>_> *)local_658);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)(local_558 + 0x10));
  boost::detail::test_impl
            ("data.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa41,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_658);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa42,"void swap_suite::swap_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            ((type *)&data_5.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_558 + 0x10));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &data_5.storage.field_0x28,"alpha");
  boost::detail::test_impl
            ("data.value<string>() == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa43,"void swap_suite::swap_array()",bVar1);
  std::__cxx11::string::~string((string *)&data_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_558 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_778,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_748,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_718,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6e8,"alpha");
  local_6b8._0_8_ = &local_778;
  local_6b8._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_6b8);
  local_1420 = (basic_variable<std::allocator<char>_> *)local_6b8;
  do {
    local_1420 = local_1420 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1420);
  } while (local_1420 != &local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_7b8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10),
             (basic_variable<std::allocator<char>_> *)local_7b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                    ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  boost::detail::test_impl
            ("data.is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa4b,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_7b8);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa4c,"void swap_suite::swap_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::wstring>
            ((type *)&data_6.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)&data_6.storage.field_0x28,L"bravo");
  boost::detail::test_impl
            ("data.value<wstring>() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa4d,"void swap_suite::swap_array()",bVar1);
  std::__cxx11::wstring::~wstring((wstring *)&data_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_8d8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_8a8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_878,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_848,"alpha");
  local_818._0_8_ = &local_8d8;
  local_818._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_818 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_818);
  local_1448 = (basic_variable<std::allocator<char>_> *)local_818;
  do {
    local_1448 = local_1448 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1448);
  } while (local_1448 != &local_8d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_918,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_818 + 0x10),
             (basic_variable<std::allocator<char>_> *)local_918);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                    ((basic_variable<std::allocator<char>_> *)(local_818 + 0x10));
  boost::detail::test_impl
            ("data.is<u16string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa55,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_918);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa56,"void swap_suite::swap_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::u16string>
            ((type *)&data_7.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_818 + 0x10));
  bVar1 = std::operator==((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                           *)&data_7.storage.field_0x28,L"charlie");
  boost::detail::test_impl
            ("data.value<u16string>() == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa57,"void swap_suite::swap_array()",bVar1);
  std::__cxx11::u16string::~u16string((u16string *)&data_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_918);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_818 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_a38,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_a08,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_9d8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9a8,"alpha");
  local_978._0_8_ = &local_a38;
  local_978._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_978);
  local_1470 = (basic_variable<std::allocator<char>_> *)local_978;
  do {
    local_1470 = local_1470 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1470);
  } while (local_1470 != &local_a38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a78,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10),
             (basic_variable<std::allocator<char>_> *)local_a78);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10));
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa5f,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_a78);
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa60,"void swap_suite::swap_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::u32string>
            ((type *)&data_8.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_978 + 0x10));
  bVar1 = std::operator==((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)&data_8.storage.field_0x28,L"delta");
  boost::detail::test_impl
            ("data.value<u32string>() == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa61,"void swap_suite::swap_array()",bVar1);
  std::__cxx11::u32string::~u32string((u32string *)&data_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_b98,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_b68,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_b38,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b08,"alpha");
  local_ad8._0_8_ = &local_b98;
  local_ad8._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_ac8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_ad8);
  local_1498 = (basic_variable<std::allocator<char>_> *)local_ad8;
  do {
    local_1498 = local_1498 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1498);
  } while (local_1498 != &local_b98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_ca8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_c78,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_c48,2.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c18,"bravo");
  local_be8._0_8_ = &local_ca8;
  local_be8._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_bd8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_be8);
  local_14b0 = (basic_variable<std::allocator<char>_> *)local_be8;
  do {
    local_14b0 = local_14b0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_14b0);
  } while (local_14b0 != &local_ca8);
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)local_ac8,
             (basic_variable<std::allocator<char>_> *)local_bd8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_ac8);
  boost::detail::test_impl
            ("data.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa69,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_bd8);
  pcVar3 = "void swap_suite::swap_array()";
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa6a,"void swap_suite::swap_array()",bVar1);
  local_dc0 = &local_db8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_dc0,false);
  local_dc0 = &local_d88;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_dc0,1);
  local_dc0 = &local_d58;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_dc0,2.0);
  local_dc0 = &local_d28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_dc0,"bravo");
  local_cf8._0_8_ = &local_db8;
  local_cf8._8_8_ = 4;
  init._M_len = (size_type)pcVar3;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_cf8._0_8_,init);
  local_14d0 = (basic_variable<std::allocator<char>_> *)local_cf8;
  do {
    local_14d0 = local_14d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_14d0);
  } while (local_14d0 != &local_db8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_dd8,(basic_variable<std::allocator<char>_> *)local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_df0,(basic_variable<std::allocator<char>_> *)local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_e08,(basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_e20,(basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa6f,"void swap_suite::swap_array()",&local_dd8,&local_df0,&local_e08,&local_e20);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e20);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e08);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_df0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_dd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_cf8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_bd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_f28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_ef8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_ec8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e98,"alpha");
  local_e68._0_8_ = &local_f28;
  local_e68._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e58,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_e68);
  pbVar4 = &local_f28;
  local_14e8 = (basic_variable<std::allocator<char>_> *)local_e68;
  do {
    local_14e8 = local_14e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_14e8);
  } while (local_14e8 != pbVar4);
  local_1100 = &local_10f8;
  local_1101 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_1100,(char (*) [6])"alpha",&local_1101);
  local_1100 = &local_1098;
  local_1108 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_1100,(char (*) [6])"bravo",&local_1108);
  local_1100 = &local_1038;
  local_1110 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>(local_1100,(char (*) [8])"charlie",&local_1110);
  local_1100 = &local_fd8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (local_1100,(char (*) [6])"delta",(char (*) [10])"beryllium");
  local_f78._0_8_ = &local_10f8;
  local_f78._8_8_ = 4;
  init_00._M_len = (size_type)pbVar4;
  init_00._M_array = (iterator)0x4;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_f68,
             (basic_map<std::allocator<char>_> *)local_f78._0_8_,init_00);
  local_1500 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_f78;
  do {
    local_1500 = local_1500 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1500);
  } while (local_1500 != &local_10f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)local_e58,
             (basic_variable<std::allocator<char>_> *)local_f68);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_map<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_e58);
  boost::detail::test_impl
            ("data.is<map>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa7d,"void swap_suite::swap_array()",bVar1);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_f68);
  pcVar3 = "void swap_suite::swap_array()";
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa7e,"void swap_suite::swap_array()",bVar1);
  local_12e0 = &local_12d8;
  local_12e1 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_12e0,(char (*) [6])"alpha",&local_12e1);
  local_12e0 = &local_1278;
  local_12e8 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_12e0,(char (*) [6])"bravo",&local_12e8);
  local_12e0 = &local_1218;
  local_12f0 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>(local_12e0,(char (*) [8])"charlie",&local_12f0);
  local_12e0 = &local_11b8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (local_12e0,(char (*) [6])"delta",(char (*) [10])"beryllium");
  local_1158._0_8_ = &local_12d8;
  local_1158._8_8_ = 4;
  init_01._M_len = (size_type)pcVar3;
  init_01._M_array = (iterator)0x4;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1158 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1158._0_8_,init_01);
  local_1520 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1158;
  do {
    local_1520 = local_1520 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1520);
  } while (local_1520 != &local_12d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1308,(basic_variable<std::allocator<char>_> *)local_e58);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1320,(basic_variable<std::allocator<char>_> *)local_e58);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1338,(basic_variable<std::allocator<char>_> *)(local_1158 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1350,(basic_variable<std::allocator<char>_> *)(local_1158 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0xa89,"void swap_suite::swap_array()",&local_1308,&local_1320,&local_1338,&local_1350)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1338);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1320);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1308);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1158 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_f68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e58);
  return;
}

Assistant:

void swap_array()
{
    // array - null
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other;

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<nullable>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
    }
    // array - boolean
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other(true);

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
        TRIAL_PROTOCOL_TEST(data.value<boolean>() == true);
    }
    // array - integer
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other(2);

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<integer>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
        TRIAL_PROTOCOL_TEST(data.value<integer>() == 2);
    }
    // array - real
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other(3.0);

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<real>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
        TRIAL_PROTOCOL_TEST(data.value<real>() == 3.0);
    }
    // array - string
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other("alpha");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<string>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
        TRIAL_PROTOCOL_TEST(data.value<string>() == "alpha");
    }
    // array - wstring
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other(L"bravo");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<wstring>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
        TRIAL_PROTOCOL_TEST(data.value<wstring>() == L"bravo");
    }
    // array - u16string
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other(u"charlie");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<u16string>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
        TRIAL_PROTOCOL_TEST(data.value<u16string>() == u"charlie");
    }
    // array - u32string
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other(U"delta");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(other.is<array>());
        TRIAL_PROTOCOL_TEST(data.value<u32string>() == U"delta");
    }
    // array - array
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other = { false, 1, 2.0, "bravo" };

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<array>());
        TRIAL_PROTOCOL_TEST(other.is<array>());

        variable expect = array::make({ false, 1, 2.0, "bravo" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    // array - map
    {
        variable data = { true, 2, 3.0, "alpha" };
        variable other = map::make(
            {
                { "alpha", true },
                { "bravo", 2 },
                { "charlie", 3.0 },
                { "delta", "beryllium" }
            });

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<map>());
        TRIAL_PROTOCOL_TEST(other.is<array>());

        variable expect = map::make(
            {
                { "alpha", true },
                { "bravo", 2 },
                { "charlie", 3.0 },
                { "delta", "beryllium" }
            });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}